

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O0

Cut_Cut_t * Cut_CutStart(Cut_Oracle_t *p)

{
  Cut_Cut_t *__s;
  Cut_Cut_t *pCut;
  Cut_Oracle_t *p_local;
  
  __s = (Cut_Cut_t *)Extra_MmFixedEntryFetch(p->pMmCuts);
  memset(__s,0,0x18);
  *(uint *)__s = *(uint *)__s & 0xf0ffffff | (p->pParams->nVarsMax & 0xfU) << 0x18;
  *(uint *)__s = *(uint *)__s & 0xffbfffff | (p->fSimul & 1U) << 0x16;
  p->nCuts = p->nCuts + 1;
  return __s;
}

Assistant:

Cut_Cut_t * Cut_CutStart( Cut_Oracle_t * p )
{
    Cut_Cut_t * pCut;
    // cut allocation
    pCut = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
    memset( pCut, 0, sizeof(Cut_Cut_t) );
    pCut->nVarsMax   = p->pParams->nVarsMax;
    pCut->fSimul     = p->fSimul;
    p->nCuts++;
    return pCut;
}